

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O1

void __thiscall QItemDelegate::setEditorData(QItemDelegate *this,QWidget *editor,QModelIndex *index)

{
  QAbstractItemModel *pQVar1;
  int *piVar2;
  char *pcVar3;
  QMetaType QVar4;
  QVariant *pQVar5;
  long in_FS_OFFSET;
  QByteArray local_a8;
  QVariant local_88;
  QVariant local_68;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = (index->m).ptr;
  if (pQVar1 == (QAbstractItemModel *)0x0) {
    local_48.shared = (PrivateShared *)0x0;
    local_48._8_8_ = (undefined1 *)0x0;
    local_48._16_8_ = (undefined1 *)0x0;
    puStack_30 = (undefined1 *)0x2;
  }
  else {
    (**(code **)(*(long *)pQVar1 + 0x90))(&local_48,pQVar1,index,2);
  }
  local_a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d.d._0_4_ = 0xaaaaaaaa;
  local_a8.d.d._4_4_ = 0xaaaaaaaa;
  local_a8.d.ptr._0_4_ = 0xaaaaaaaa;
  local_a8.d.ptr._4_4_ = 0xaaaaaaaa;
  (*(code *)**(undefined8 **)editor)(editor);
  QMetaObject::userProperty();
  pcVar3 = (char *)QMetaProperty::name();
  QByteArray::QByteArray(&local_a8,pcVar3,-1);
  if ((undefined1 *)local_a8.d.size != (undefined1 *)0x0) {
    if (puStack_30 < (undefined1 *)0x4) {
      QObject::property((char *)&local_88);
      QVar4.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      ::QVariant::QVariant(&local_68,QVar4,(void *)0x0);
      ::QVariant::operator=((QVariant *)&local_48,&local_68);
      ::QVariant::~QVariant(&local_68);
      ::QVariant::~QVariant(&local_88);
    }
    pQVar5 = (QVariant *)CONCAT44(local_a8.d.ptr._4_4_,local_a8.d.ptr._0_4_);
    if (pQVar5 == (QVariant *)0x0) {
      pQVar5 = (QVariant *)&QByteArray::_empty;
    }
    QObject::doSetProperty((char *)editor,pQVar5,(QVariant *)&local_48);
  }
  piVar2 = (int *)CONCAT44(local_a8.d.d._4_4_,local_a8.d.d._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_a8.d.d._4_4_,local_a8.d.d._0_4_),1,0x10);
    }
  }
  ::QVariant::~QVariant((QVariant *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QItemDelegate::setEditorData(QWidget *editor, const QModelIndex &index) const
{
    QVariant v = index.data(Qt::EditRole);
    QByteArray n = editor->metaObject()->userProperty().name();

    if (!n.isEmpty()) {
        if (!v.isValid())
            v = QVariant(editor->property(n).metaType());
        editor->setProperty(n, v);
    }
}